

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O0

attr_list libcmsockets_LTX_non_blocking_listen
                    (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
                    attr_list listen_info)

{
  code *pcVar1;
  atom_t aVar2;
  undefined8 uVar3;
  uint16_t uVar4;
  int iVar5;
  __pid_t _Var6;
  int iVar7;
  time_t tVar8;
  void *pvVar9;
  attr_list p_Var10;
  char *pcVar11;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  attr_list ret_list;
  int int_port_num;
  int target;
  int result;
  int tries;
  int size;
  long seedval;
  int i;
  char host_name [256];
  int IP;
  int use_hostname;
  int port_range_high;
  int port_range_low;
  u_short port_num;
  int attr_port_num;
  int conn_sock;
  int sock_opt_val;
  sockaddr_in sock_addr;
  uint length;
  socket_client_data_ptr sd;
  int local_184;
  int local_180;
  int local_17c;
  int local_16c;
  char local_168 [260];
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  uint16_t local_52;
  uint local_50;
  int local_4c;
  undefined4 local_48;
  sockaddr local_44;
  socklen_t local_34;
  long *local_30;
  long local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  
  local_30 = *(long **)(in_RDX + 0x98);
  local_48 = 1;
  local_4c = 0;
  local_50 = 0;
  local_52 = 0;
  local_60 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((*local_30 != 0) &&
     (iVar5 = (**(code **)(in_RSI + 0xb8))
                        (*local_30,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmsockets.c"
                         ,0x29e), iVar5 == 0)) {
    __assert_fail("CM_LOCKED(svc, sd->cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmsockets.c"
                  ,0x29e,
                  "attr_list libcmsockets_LTX_non_blocking_listen(CManager, CMtrans_services, transport_entry, attr_list)"
                 );
  }
  if ((local_28 == 0) || (iVar5 = query_attr(local_28,CM_IP_PORT,0,&local_50), iVar5 != 0)) {
    if ((0xffff < (int)local_50) || ((int)local_50 < 0)) {
      fprintf(_stderr,"Requested port number %d is invalid\n",(ulong)local_50);
      return (attr_list)0x0;
    }
    local_52 = (uint16_t)local_50;
  }
  else {
    local_52 = 0;
  }
  (**(code **)(local_18 + 0x30))(local_10,"CMSocket begin listen, requested port %d",local_50);
  get_IP_config((char *)host_name._128_8_,host_name._124_4_,(int *)host_name._112_8_,
                (int *)host_name._104_8_,(int *)host_name._96_8_,(int *)host_name._88_8_,
                (attr_list)host_name._144_8_,(CMTransport_trace)host_name._152_8_,
                (void *)host_name._160_8_);
  local_44.sa_family = 2;
  local_44.sa_data[2] = '\0';
  local_44.sa_data[3] = '\0';
  local_44.sa_data[4] = '\0';
  local_44.sa_data[5] = '\0';
  local_44.sa_data._0_2_ = htons(local_52);
  for (local_16c = 0; local_16c < (int)local_30[2]; local_16c = local_16c + 1) {
    if ((*(uint *)(local_30[4] + (long)local_16c * 4) == (uint)local_52) ||
       ((local_58 <= *(int *)(local_30[4] + (long)local_16c * 4) &&
        (*(int *)(local_30[4] + (long)local_16c * 4) <= local_5c)))) {
      local_4c = *(int *)(local_30[3] + (long)local_16c * 4);
    }
  }
  if (local_4c == 0) {
    local_4c = socket(2,1,0);
    if (local_4c == -1) {
      fprintf(_stderr,"Cannot open INET socket\n");
      return (attr_list)0x0;
    }
    if (local_44.sa_data._0_2_ == 0) {
      if (local_5c == -1) {
        local_44.sa_data[0] = '\0';
        local_44.sa_data[1] = '\0';
        (**(code **)(local_18 + 0x30))(local_10,"CMSocket trying to bind to any available port");
        iVar5 = bind(local_4c,&local_44,0x10);
        if (iVar5 == -1) {
          fprintf(_stderr,"Cannot bind INET socket\n");
          return (attr_list)0x0;
        }
      }
      else {
        tVar8 = time((time_t *)0x0);
        _Var6 = getpid();
        local_17c = local_5c - local_58;
        local_180 = 0x1e;
        local_184 = -1;
        srand((int)tVar8 + _Var6);
        while (iVar5 = local_58, 0 < local_180) {
          iVar7 = rand();
          iVar5 = iVar5 + iVar7 % local_17c;
          local_44.sa_data._0_2_ = htons((uint16_t)iVar5);
          (**(code **)(local_18 + 0x30))(local_10,"CMSocket trying to bind port %d",iVar5);
          local_184 = bind(local_4c,&local_44,0x10);
          local_180 = local_180 + -1;
          if (local_184 != -1) {
            local_180 = 0;
          }
          if (local_180 % 5 == 4) {
            tVar8 = time((time_t *)0x0);
            _Var6 = getpid();
            srand((int)tVar8 + _Var6);
          }
          if (local_180 == 0x14) {
            local_17c = local_17c * 10;
          }
          if (local_180 == 10) {
            local_17c = local_17c * 10;
          }
        }
        if (local_184 == -1) {
          fprintf(_stderr,"Cannot bind INET socket\n");
          return (attr_list)0x0;
        }
      }
    }
    else {
      iVar5 = setsockopt(local_4c,1,2,&local_48,4);
      if (iVar5 != 0) {
        fprintf(_stderr,"Failed to set REUSEADDR on INET socket before bind\n");
        perror("setsockopt(SO_REUSEADDR) failed");
        return (attr_list)0x0;
      }
      local_48 = 1;
      iVar5 = setsockopt(local_4c,1,0xf,&local_48,4);
      if (iVar5 != 0) {
        fprintf(_stderr,"Failed to set REUSEADDR on INET socket before bind\n");
        perror("setsockopt(SO_REUSEPORT) failed");
        return (attr_list)0x0;
      }
      (**(code **)(local_18 + 0x30))(local_10,"CMSocket trying to bind selected port %d",local_52);
      iVar5 = bind(local_4c,&local_44,0x10);
      if (iVar5 == -1) {
        fprintf(_stderr,"Cannot bind INET socket\n");
        return (attr_list)0x0;
      }
    }
    iVar5 = listen(local_4c,0x400);
    if (iVar5 != 0) {
      fprintf(_stderr,"listen failed\n");
      return (attr_list)0x0;
    }
    (**(code **)(local_18 + 0x30))
              (local_10,"CMSockets Adding socket_accept_conn as action on fd %d",local_4c);
    (**(code **)(local_18 + 0x18))(local_10,local_4c,socket_accept_conn,local_20,(long)local_4c);
    local_34 = 0x10;
    iVar5 = getsockname(local_4c,&local_44,&local_34);
    if (iVar5 < 0) {
      fprintf(_stderr,"Cannot get socket name\n");
      return (attr_list)0x0;
    }
    pvVar9 = realloc((void *)local_30[3],(long)((int)local_30[2] + 1) << 2);
    local_30[3] = (long)pvVar9;
    pvVar9 = realloc((void *)local_30[4],(long)((int)local_30[2] + 1) << 2);
    local_30[4] = (long)pvVar9;
    *(int *)(local_30[3] + (long)(int)local_30[2] * 4) = local_4c;
    uVar4 = ntohs(local_44.sa_data._0_2_);
    *(uint *)(local_30[4] + (long)(int)local_30[2] * 4) = (uint)uVar4;
    *(int *)(local_30 + 2) = (int)local_30[2] + 1;
  }
  else {
    local_34 = 0x10;
    iVar7 = getsockname(local_4c,&local_44,&local_34);
    uVar3 = local_10;
    iVar5 = local_4c;
    if (iVar7 < 0) {
      fprintf(_stderr,"Cannot get socket name\n");
      return (attr_list)0x0;
    }
    pcVar1 = *(code **)(local_18 + 0x30);
    uVar4 = ntohs(local_44.sa_data._0_2_);
    (*pcVar1)(uVar3,"CMSockets reusing prior listen, fd %d, port %d\n",iVar5,uVar4);
  }
  uVar4 = ntohs(local_44.sa_data._0_2_);
  (**(code **)(local_18 + 0x30))
            (local_10,"CMSocket listen succeeded on port %d, fd %d",uVar4,local_4c);
  p_Var10 = (attr_list)create_attr_list();
  if (local_30[1] != 0) {
    (**(code **)(local_18 + 0x10))(local_30[1]);
  }
  pcVar11 = strdup(local_168);
  local_30[1] = (long)pcVar11;
  if ((local_64 != 0) && (local_60 == 0)) {
    add_attr(p_Var10,CM_IP_ADDR,1,(long)local_64);
  }
  pcVar11 = getenv("CMSocketsUseHostname");
  aVar2 = CM_IP_HOSTNAME;
  if ((pcVar11 == (char *)0x0) && (local_60 == 0)) {
    if (local_64 == 0) {
      add_attr(p_Var10,CM_IP_ADDR,1,0x7f000001);
    }
  }
  else {
    pcVar11 = strdup(local_168);
    add_attr(p_Var10,aVar2,3,pcVar11);
  }
  add_attr(p_Var10,CM_IP_PORT,1,uVar4);
  return p_Var10;
}

Assistant:

extern attr_list
libcmsockets_LTX_non_blocking_listen(CManager cm, CMtrans_services svc, transport_entry trans, attr_list listen_info)
{
    socket_client_data_ptr sd = trans->trans_data;
    unsigned int length;
    struct sockaddr_in sock_addr;
    int sock_opt_val = 1;
    SOCKET conn_sock = 0;
    int attr_port_num = 0;
    u_short port_num = 0;
    int port_range_low, port_range_high;
    int use_hostname = 0;
    int IP;
    char host_name[256];

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    /* 
     *  Check to see if a bind to a specific port was requested
     */
    if (listen_info != NULL
	&& !query_attr(listen_info, CM_IP_PORT,
		       NULL, (attr_value *)(intptr_t) & attr_port_num)) {
	port_num = 0;
    } else {
	if (attr_port_num > USHRT_MAX || attr_port_num < 0) {
	    fprintf(stderr, "Requested port number %d is invalid\n", attr_port_num);
	    return NULL;
	}
	port_num = attr_port_num;
    }

    svc->trace_out(cm, "CMSocket begin listen, requested port %d", attr_port_num);
    get_IP_config(host_name, sizeof(host_name), &IP, &port_range_low, &port_range_high, 
		  &use_hostname, listen_info, svc->trace_out, (void *)cm);

    sock_addr.sin_family = AF_INET;
    sock_addr.sin_addr.s_addr = INADDR_ANY;
    sock_addr.sin_port = htons(port_num);

    for (int i = 0; i < sd->listen_count; i++) {
	if ((sd->listen_ports[i] == port_num) ||
	    ((sd->listen_ports[i] >= port_range_low) &&
	     (sd->listen_ports[i] <= port_range_high))) {
	    conn_sock = sd->listen_fds[i];
	}
    }
    if (!conn_sock) {
	conn_sock = socket(AF_INET, SOCK_STREAM, 0);
	if (conn_sock == SOCKET_ERROR) {
	    fprintf(stderr, "Cannot open INET socket\n");
	    return NULL;
	}
	if (sock_addr.sin_port != 0) {
	    /* specific port requested. set REUSEADDR, REUSEPORT because previous server might have died badly */
	    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEADDR, (char *) &sock_opt_val,
			   sizeof(sock_opt_val)) != 0) {
		fprintf(stderr, "Failed to set REUSEADDR on INET socket before bind\n");
		perror("setsockopt(SO_REUSEADDR) failed");
		return NULL;
	    }
#ifdef SO_REUSEPORT
	    sock_opt_val = 1;
	    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEPORT, (const char*)&sock_opt_val, sizeof(sock_opt_val)) != 0) {
		fprintf(stderr, "Failed to set REUSEADDR on INET socket before bind\n");
		perror("setsockopt(SO_REUSEPORT) failed");
		return NULL;
	    }
#endif
	    svc->trace_out(cm, "CMSocket trying to bind selected port %d", port_num);
	    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
		     sizeof sock_addr) == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	} else if (port_range_high == -1) {
	    /* bind to any port, range unconstrained */
	    sock_addr.sin_port = 0;
	    svc->trace_out(cm, "CMSocket trying to bind to any available port");
	    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
		     sizeof sock_addr) == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	} else {
	    long seedval = (long) time(NULL) + getpid();
	    /* port num is free.  Constrain to range to standards */
	    int size = port_range_high - port_range_low;
	    int tries = 30;
	    int result = SOCKET_ERROR;
	    srand(seedval);
	    while (tries > 0) {
		int target = port_range_low + (rand() % size);
		sock_addr.sin_port = htons(target);
		svc->trace_out(cm, "CMSocket trying to bind port %d", target);
		result = bind(conn_sock, (struct sockaddr *) &sock_addr,
			      sizeof sock_addr);
		tries--;
		if (result != SOCKET_ERROR) tries = 0;
		if (tries%5 == 4) {
		    /* try reseeding in case we're in sync with another process */
		    srand((int)time(NULL) + (int)getpid());
		}
		if (tries == 20) {
		    /* damn, tried a lot, increase the range (This might violate specified range) */
		    size *= 10;
		}
		if (tries == 10) {
		    /* damn, tried a lot more, increase the range (This might violate specified range) */
		    size *= 10;
		}
	    }
	    if (result == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	}
	/* begin listening for conns and set the backlog */
	if (listen(conn_sock, FD_SETSIZE)) {
	    fprintf(stderr, "listen failed\n");
	    return NULL;
	}
	svc->trace_out(cm, "CMSockets Adding socket_accept_conn as action on fd %d", conn_sock);
	svc->fd_add_select(cm, conn_sock, (select_list_func)socket_accept_conn,
			   (void *) trans, (void *) (intptr_t)conn_sock);

	length = sizeof(sock_addr);
	if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	    fprintf(stderr, "Cannot get socket name\n");
	    return NULL;
	}
	sd->listen_fds = realloc(sd->listen_fds,
				 sizeof(SOCKET)*(sd->listen_count+1));
	sd->listen_ports = realloc(sd->listen_ports,
				 sizeof(int)*(sd->listen_count+1));
	sd->listen_fds[sd->listen_count] = conn_sock;
	sd->listen_ports[sd->listen_count] = ntohs(sock_addr.sin_port);
	sd->listen_count++;
    } else {
	length = sizeof(sock_addr);
	if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	    fprintf(stderr, "Cannot get socket name\n");
	    return NULL;
	}
	svc->trace_out(cm, "CMSockets reusing prior listen, fd %d, port %d\n", conn_sock, ntohs(sock_addr.sin_port));
    }
    /* set the port num as one we can be contacted at */
    {
	int int_port_num = ntohs(sock_addr.sin_port);
	attr_list ret_list;

	svc->trace_out(cm, "CMSocket listen succeeded on port %d, fd %d",
		       int_port_num, conn_sock);
	ret_list = create_attr_list();

	if (sd->hostname != NULL)
	    svc->free_func(sd->hostname);
	sd->hostname = strdup(host_name);
	if ((IP != 0) && (!use_hostname)) {
	    add_attr(ret_list, CM_IP_ADDR, Attr_Int4,
		     (attr_value) (intptr_t)IP);
	}
	if ((getenv("CMSocketsUseHostname") != NULL) || 
	    use_hostname) {
	    add_attr(ret_list, CM_IP_HOSTNAME, Attr_String,
		     (attr_value) strdup(host_name));
	} else if (IP == 0) {
	    add_attr(ret_list, CM_IP_ADDR, Attr_Int4, 
		     (attr_value)INADDR_LOOPBACK);
	}
	add_attr(ret_list, CM_IP_PORT, Attr_Int4,
		 (attr_value) (intptr_t)int_port_num);

	return ret_list;
    }
}